

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

bool __thiscall sf::Texture::loadFromImage(Texture *this,Image *image,IntRect *area)

{
  bool bVar1;
  Vector2u VVar2;
  ulong *in_RDX;
  Image *in_RSI;
  long in_RDI;
  int i;
  Uint8 *pixels;
  TextureSaver save;
  TransientContextLock lock;
  IntRect rectangle;
  uint in_stack_00000070;
  uint in_stack_00000074;
  Texture *in_stack_00000078;
  int height;
  char *in_stack_00000090;
  int width;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  TransientContextLock *in_stack_ffffffffffffff60;
  Image *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int local_7c;
  Uint8 *local_78;
  undefined8 local_58;
  undefined8 local_50;
  uint local_40;
  uint uStack_34;
  uint local_2c;
  bool local_1;
  
  VVar2 = Image::getSize(in_RSI);
  local_2c = VVar2.x;
  VVar2 = Image::getSize(in_RSI);
  uStack_34 = VVar2.y;
  if ((((int)in_RDX[1] == 0) || (*(int *)((long)in_RDX + 0xc) == 0)) ||
     (((int)*in_RDX < 1 &&
      (((*(int *)((long)in_RDX + 4) < 1 && ((int)local_2c <= (int)in_RDX[1])) &&
       ((int)uStack_34 <= *(int *)((long)in_RDX + 0xc))))))) {
    VVar2 = Image::getSize(in_RSI);
    local_40 = VVar2.x;
    Image::getSize(in_RSI);
    bVar1 = create(in_stack_00000078,in_stack_00000074,in_stack_00000070);
    if (bVar1) {
      update((Texture *)CONCAT44(local_40,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_58 = *in_RDX;
    local_50 = in_RDX[1];
    if ((int)local_58 < 0) {
      local_58 = local_58 & 0xffffffff00000000;
    }
    if ((long)local_58 < 0) {
      local_58 = local_58 & 0xffffffff;
    }
    if ((int)local_2c < (int)local_58 + (int)local_50) {
      local_50._4_4_ = (int)(local_50 >> 0x20);
      local_50 = CONCAT44(local_50._4_4_,local_2c - (int)local_58);
    }
    if ((int)uStack_34 < local_58._4_4_ + local_50._4_4_) {
      local_50 = CONCAT44(uStack_34 - local_58._4_4_,(int)local_50);
    }
    bVar1 = create(in_stack_00000078,in_stack_00000074,in_stack_00000070);
    if (bVar1) {
      GlResource::TransientContextLock::TransientContextLock(in_stack_ffffffffffffff60);
      priv::TextureSaver::TextureSaver
                ((TextureSaver *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      local_78 = Image::getPixelsPtr((Image *)CONCAT44(in_stack_ffffffffffffff4c,
                                                       in_stack_ffffffffffffff48));
      local_78 = local_78 + (int)(((int)local_58 + local_2c * local_58._4_4_) * 4);
      glBindTexture(0xde1,*(undefined4 *)(in_RDI + 0x10));
      priv::glCheckError((char *)image,area._4_4_,in_stack_00000090);
      for (local_7c = 0; local_7c < local_50._4_4_; local_7c = local_7c + 1) {
        in_stack_ffffffffffffff50 = 0x1401;
        glTexSubImage2D(0xde1,0,0,local_7c,local_50 & 0xffffffff,1,0x1908,0x1401,local_78);
        priv::glCheckError((char *)image,area._4_4_,in_stack_00000090);
        local_78 = local_78 + (int)(local_2c << 2);
      }
      glTexParameteri(0xde1,0x2801,*(byte *)(in_RDI + 0x14) & 1 | 0x2600);
      priv::glCheckError((char *)image,area._4_4_,in_stack_00000090);
      *(undefined1 *)(in_RDI + 0x19) = 0;
      glFlush();
      priv::glCheckError((char *)image,area._4_4_,in_stack_00000090);
      local_1 = true;
      priv::TextureSaver::~TextureSaver
                ((TextureSaver *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      GlResource::TransientContextLock::~TransientContextLock
                ((TransientContextLock *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool Texture::loadFromImage(const Image& image, const IntRect& area)
{
    // Retrieve the image size
    int width = static_cast<int>(image.getSize().x);
    int height = static_cast<int>(image.getSize().y);

    // Load the entire image if the source area is either empty or contains the whole image
    if (area.width == 0 || (area.height == 0) ||
       ((area.left <= 0) && (area.top <= 0) && (area.width >= width) && (area.height >= height)))
    {
        // Load the entire image
        if (create(image.getSize().x, image.getSize().y))
        {
            update(image);

            return true;
        }
        else
        {
            return false;
        }
    }
    else
    {
        // Load a sub-area of the image

        // Adjust the rectangle to the size of the image
        IntRect rectangle = area;
        if (rectangle.left   < 0) rectangle.left = 0;
        if (rectangle.top    < 0) rectangle.top  = 0;
        if (rectangle.left + rectangle.width > width)  rectangle.width  = width - rectangle.left;
        if (rectangle.top + rectangle.height > height) rectangle.height = height - rectangle.top;

        // Create the texture and upload the pixels
        if (create(rectangle.width, rectangle.height))
        {
            TransientContextLock lock;

            // Make sure that the current texture binding will be preserved
            priv::TextureSaver save;

            // Copy the pixels to the texture, row by row
            const Uint8* pixels = image.getPixelsPtr() + 4 * (rectangle.left + (width * rectangle.top));
            glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
            for (int i = 0; i < rectangle.height; ++i)
            {
                glCheck(glTexSubImage2D(GL_TEXTURE_2D, 0, 0, i, rectangle.width, 1, GL_RGBA, GL_UNSIGNED_BYTE, pixels));
                pixels += 4 * width;
            }

            glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
            m_hasMipmap = false;

            // Force an OpenGL flush, so that the texture will appear updated
            // in all contexts immediately (solves problems in multi-threaded apps)
            glCheck(glFlush());

            return true;
        }
        else
        {
            return false;
        }
    }
}